

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O0

OffsetRange __thiscall
wabt::LexerSourceLineFinder::ClampSourceLineOffsets
          (LexerSourceLineFinder *this,OffsetRange offset_range,ColumnRange column_range,
          Offset max_line_length)

{
  OffsetRange OVar1;
  int iVar2;
  ColumnRange *pCVar3;
  unsigned_long local_58;
  ulong local_50;
  size_t center_on;
  size_t column_count;
  Offset line_length;
  Offset max_line_length_local;
  ColumnRange column_range_local;
  OffsetRange offset_range_local;
  
  max_line_length_local = offset_range.end;
  offset_range_local.start = offset_range.start;
  line_length = (Offset)column_range;
  column_range_local = (ColumnRange)this;
  column_count = Range<unsigned_long>::size((Range<unsigned_long> *)&column_range_local);
  if (line_length < column_count) {
    iVar2 = Range<int>::size((Range<int> *)&max_line_length_local);
    center_on = (size_t)iVar2;
    iVar2 = (int)max_line_length_local;
    if (center_on <= line_length) {
      iVar2 = ((int)max_line_length_local + max_line_length_local._4_4_) / 2;
    }
    local_50 = (ulong)(iVar2 + -1);
    if (line_length >> 1 < local_50) {
      column_range_local = (ColumnRange)((local_50 - (line_length >> 1)) + (long)column_range_local)
      ;
    }
    local_58 = offset_range_local.start - line_length;
    pCVar3 = (ColumnRange *)std::min<unsigned_long>((unsigned_long *)&column_range_local,&local_58);
    column_range_local = *pCVar3;
    offset_range_local.start = (long)column_range_local + line_length;
  }
  OVar1.end = offset_range_local.start;
  OVar1.start._0_4_ = column_range_local.start;
  OVar1.start._4_4_ = column_range_local.end;
  return OVar1;
}

Assistant:

OffsetRange LexerSourceLineFinder::ClampSourceLineOffsets(
    OffsetRange offset_range,
    ColumnRange column_range,
    Offset max_line_length) {
  Offset line_length = offset_range.size();
  if (line_length > max_line_length) {
    size_t column_count = column_range.size();
    size_t center_on;
    if (column_count > max_line_length) {
      // The column range doesn't fit, just center on first_column.
      center_on = column_range.start - 1;
    } else {
      // the entire range fits, display it all in the center.
      center_on = (column_range.start + column_range.end) / 2 - 1;
    }
    if (center_on > max_line_length / 2) {
      offset_range.start += center_on - max_line_length / 2;
    }
    offset_range.start =
        std::min(offset_range.start, offset_range.end - max_line_length);
    offset_range.end = offset_range.start + max_line_length;
  }

  return offset_range;
}